

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNewFixed
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ArrayNewFixed *curr)

{
  Type *this_00;
  Flow *pFVar1;
  Literal *pLVar2;
  HeapType type;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  HeapType heapType;
  anon_union_16_5_9943fe1e_for_Literal_0 local_100;
  Literal local_e8;
  undefined1 local_d0 [8];
  Literals data;
  shared_ptr<wasm::GCData> local_70;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *local_60;
  Literal *local_58;
  size_t local_50;
  ExpressionRunner<wasm::ModuleRunner> *local_48;
  Flow *local_40;
  undefined1 local_31;
  
  uVar3 = (curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  uVar6 = (uint)uVar3;
  local_48 = this;
  if (0x2aaaaa9 < uVar6) {
    (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
  }
  local_40 = __return_storage_ptr__;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id == 1) {
    local_50 = (curr->values).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    if (local_50 != 0) {
      uVar3 = 0;
      do {
        pFVar1 = local_40;
        if ((curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar3) goto LAB_005fd5c5;
        visit(local_40,local_48,
              (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar3]
             );
        if ((pFVar1->breakTo).super_IString.str._M_str != (char *)0x0) {
          return local_40;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        Literal::~Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                          fixed._M_elems);
        uVar3 = uVar3 + 1;
      } while (local_50 != uVar3);
    }
    handle_unreachable("unreachable but no unreachable child",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                       ,0x676);
  }
  uVar3 = uVar3 & 0xffffffff;
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type;
  wasm::Type::getHeapType(this_00);
  HeapType::getArray(&heapType);
  SmallVector<wasm::Literal,_1UL>::SmallVector((SmallVector<wasm::Literal,_1UL> *)local_d0,uVar3);
  if (uVar6 != 0) {
    local_60 = &(local_40->values).super_SmallVector<wasm::Literal,_1UL>.flexible;
    local_58 = (local_40->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems;
    sVar4 = 0xffffffffffffffe8;
    uVar5 = 0;
    do {
      pFVar1 = local_40;
      local_50 = sVar4;
      if ((curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= uVar5) {
LAB_005fd5c5:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(local_40,local_48,
            (curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar5]);
      if ((pFVar1->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_005fd597;
      pLVar2 = Flow::getSingleValue(pFVar1);
      Literal::Literal(&local_e8,pLVar2);
      truncateForPacking((Literal *)&local_100.func,local_48,&local_e8,(Field *)&heapType);
      sVar4 = local_50;
      pLVar2 = (Literal *)
               (data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + local_50);
      if (uVar5 == 0) {
        pLVar2 = (Literal *)&data;
      }
      Literal::operator=(pLVar2,(Literal *)&local_100.func);
      Literal::~Literal((Literal *)&local_100.func);
      Literal::~Literal(&local_e8);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_60);
      Literal::~Literal(local_58);
      uVar5 = uVar5 + 1;
      sVar4 = sVar4 + 0x18;
    } while (uVar3 != uVar5);
  }
  local_100.i64 = (int64_t)wasm::Type::getHeapType(this_00);
  local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
            (&local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (GCData **)&local_70,(allocator<wasm::GCData> *)&local_31,(HeapType *)&local_100.func,
             (Literals *)local_d0);
  type = wasm::Type::getHeapType(this_00);
  pFVar1 = local_40;
  Literal::Literal((Literal *)
                   &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_70,type);
  Flow::Flow(pFVar1,(Literal *)
                    &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  Literal::~Literal((Literal *)
                    &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
LAB_005fd597:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&data);
  return local_40;
}

Assistant:

Flow visitArrayNewFixed(ArrayNewFixed* curr) {
    NOTE_ENTER("ArrayNewFixed");
    Index num = curr->values.size();
    if (num >= ArrayLimit) {
      hostLimit("allocation failure");
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* value : curr->values) {
        auto result = self()->visit(value);
        if (result.breaking()) {
          return result;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    auto field = heapType.getArray().element;
    Literals data(num);
    for (Index i = 0; i < num; i++) {
      auto value = self()->visit(curr->values[i]);
      if (value.breaking()) {
        return value;
      }
      data[i] = truncateForPacking(value.getSingleValue(), field);
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }